

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11VulkanPlatform.cpp
# Opt level: O2

Window * __thiscall
tcu::x11::VulkanDisplayXcb::createWindow
          (VulkanDisplayXcb *this,Maybe<tcu::Vector<unsigned_int,_2>_> *initialSize)

{
  int *piVar1;
  XcbDisplay *display;
  Window *pWVar2;
  XcbWindow *this_00;
  int width;
  int height;
  UniqueBase<tcu::x11::XcbWindow,_de::DefaultDeleter<tcu::x11::XcbWindow>_> local_38;
  
  piVar1 = *(int **)initialSize;
  if (piVar1 == (int *)0x0) {
    width = 400;
    height = 300;
  }
  else {
    width = *piVar1;
    height = piVar1[1];
  }
  display = (XcbDisplay *)
            (this->m_display).
            super_UniqueBase<tcu::x11::DisplayBase,_de::DefaultDeleter<tcu::x11::DisplayBase>_>.
            m_data.ptr;
  pWVar2 = (Window *)operator_new(0x20);
  this_00 = (XcbWindow *)operator_new(0x20);
  XcbWindow::XcbWindow(this_00,display,width,height,(xcb_visualid_t *)0x0);
  pWVar2[1]._vptr_Window = (_func_int **)(ulong)this_00->m_window;
  pWVar2->_vptr_Window = (_func_int **)&PTR__VulkanWindowXcb_01db6640;
  local_38.m_data.ptr = (XcbWindow *)0x0;
  pWVar2[2]._vptr_Window = (_func_int **)this_00;
  de::details::UniqueBase<tcu::x11::XcbWindow,_de::DefaultDeleter<tcu::x11::XcbWindow>_>::
  ~UniqueBase(&local_38);
  return pWVar2;
}

Assistant:

VulkanWindowXlib (MovePtr<XlibWindow> window)
		: vk::wsi::XlibWindowInterface	(vk::pt::XlibWindow(window->getXID()))
		, m_window						(window)
	{
	}